

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::invoke_finalizer(CVmObjTads *this,vm_obj_id_t self)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  vm_obj_id_t srcobj;
  vm_val_t val;
  vm_val_t self_val;
  vm_val_t srcobj_val;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (G_predef_X.obj_destruct != 0) {
    iVar3 = (*(this->super_CVmObject)._vptr_CVmObject[0xd])
                      (this,(ulong)G_predef_X.obj_destruct,&val,self,&srcobj,0);
    if (((iVar3 != 0) && (val.typ < VM_FIRST_INVALID_TYPE)) &&
       ((0x64800U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      err_cur__.prv_ = (err_frame_t *)*puVar4;
      plVar5 = (long *)_ZTW11G_err_frame();
      *plVar5 = (long)&err_cur__;
      err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
      if (err_cur__.state_ == 0) {
        self_val.typ = VM_OBJ;
        srcobj_val.val.obj = srcobj;
        rc.name = "TadsObject.finalize";
        rc.bifptr.typ = VM_NIL;
        rc.method_idx = 0;
        rc.argc = 0;
        rc.argp = (vm_val_t *)0x0;
        rc.caller_addr = (uchar *)0x0;
        self_val.val.obj = self;
        srcobj_val.typ = self_val.typ;
        rc.self.typ = rc.bifptr.typ;
        CVmRun::get_prop(&G_interpreter_X,0,&srcobj_val,G_predef_X.obj_destruct,&self_val,0,&rc);
      }
      peVar1 = err_cur__.prv_;
      if (err_cur__.state_ == 1) {
        err_cur__.state_ = 2;
      }
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      *puVar4 = peVar1;
      if ((err_cur__.state_ & 0x4001U) != 0) {
        puVar4 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(byte *)*puVar4 & 2) != 0) {
          plVar5 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar5 + 0x10));
        }
        pCVar2 = err_cur__.exc_;
        plVar5 = (long *)_ZTW11G_err_frame();
        *(CVmException **)(*plVar5 + 0x10) = pCVar2;
        err_rethrow();
      }
      if ((err_cur__.state_ & 2U) != 0) {
        free(err_cur__.exc_);
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::invoke_finalizer(VMG_ vm_obj_id_t self)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* 
     *   look up the finalization method - if it's defined, and it's a
     *   method, invoke it; otherwise do nothing 
     */
    if (G_predef->obj_destruct != VM_INVALID_PROP
        && get_prop(vmg_ G_predef->obj_destruct, &val, self, &srcobj, 0)
        && (val.typ == VM_CODEOFS
            || val.typ == VM_NATIVE_CODE
            || val.typ == VM_OBJX
            || val.typ == VM_BIFPTRX))
    {
        /* 
         *   invoke the finalizer in a protected frame, to ensure that we
         *   catch any exceptions that are thrown out of the finalizer 
         */
        err_try
        {
            vm_val_t srcobj_val;
            vm_val_t self_val;

            /* 
             *   Invoke the finalizer.  Use a recursive VM invocation,
             *   since the VM must return to the garbage collector, not to
             *   what it was doing in the enclosing stack frame. 
             */
            srcobj_val.set_obj(srcobj);
            self_val.set_obj(self);
            vm_rcdesc rc("TadsObject.finalize");
            G_interpreter->get_prop(vmg_ 0, &srcobj_val,
                                    G_predef->obj_destruct, &self_val, 0, &rc);
        }
        err_catch_disc
        {
            /* silently ignore the error */
        }
        err_end;
    }